

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void hmac_apply_key(st_picotls_hmac_context_t *ctx,uint8_t pad)

{
  size_t sVar1;
  
  if (ctx->algo->block_size == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    do {
      ctx->key[sVar1] = ctx->key[sVar1] ^ pad;
      sVar1 = sVar1 + 1;
    } while (sVar1 != ctx->algo->block_size);
  }
  (*ctx->hash->update)(ctx->hash,ctx->key,sVar1);
  if (ctx->algo->block_size != 0) {
    sVar1 = 0;
    do {
      ctx->key[sVar1] = ctx->key[sVar1] ^ pad;
      sVar1 = sVar1 + 1;
    } while (sVar1 != ctx->algo->block_size);
  }
  return;
}

Assistant:

static void hmac_apply_key(struct st_picotls_hmac_context_t *ctx, uint8_t pad)
{
    size_t i;

    for (i = 0; i != ctx->algo->block_size; ++i)
        ctx->key[i] ^= pad;
    ctx->hash->update(ctx->hash, ctx->key, ctx->algo->block_size);
    for (i = 0; i != ctx->algo->block_size; ++i)
        ctx->key[i] ^= pad;
}